

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-test.cc
# Opt level: O2

void __thiscall LiteralsTest_NamedArg_Test::TestBody(LiteralsTest_NamedArg_Test *this)

{
  char *pcVar1;
  named_arg<int,_char> *in_R9;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> udl_a_w;
  char local_fc [4];
  named_arg<const_char_(&)[5],_char> local_f8;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_c0;
  undefined8 local_b8;
  wchar_t *local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> udl_a;
  named_arg<const_char_(&)[4],_char> local_68;
  
  local_c0.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1f1a9a;
  local_b8 = 5;
  local_90 = L"abra";
  local_f8.super_named_arg_base<char>.name.data_ = "second";
  local_f8.super_named_arg_base<char>.name.size_ = 6;
  local_f8.value = (char (*) [5])0x1e5707;
  local_68.value = (char (*) [4])&udl_a_w;
  udl_a_w._M_dataplus._M_p._0_4_ = 99;
  local_68.super_named_arg_base<char>.name.data_ = "third";
  local_68.super_named_arg_base<char>.name.size_ = 5;
  fmt::v5::
  format<char[30],fmt::v5::internal::named_arg<char_const(&)[5],char>,fmt::v5::internal::named_arg<char_const(&)[4],char>,fmt::v5::internal::named_arg<int,char>>
            (&udl_a,(v5 *)"{first}{second}{first}{third}",(char (*) [30])&local_c0,&local_f8,
             &local_68,in_R9);
  local_c0.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1f1a9a;
  local_b8 = 5;
  local_90 = L"abra";
  local_f8.super_named_arg_base<char>.name.data_ = "second";
  local_f8.super_named_arg_base<char>.name.size_ = 6;
  local_f8.value = (char (*) [5])0x1e5707;
  local_68.value = (char (*) [4])&gtest_ar_1.success_;
  gtest_ar_1.success_ = true;
  gtest_ar_1._1_3_ = 0;
  local_68.super_named_arg_base<char>.name.data_ = "third";
  local_68.super_named_arg_base<char>.name.size_ = 5;
  fmt::v5::
  format<char[30],fmt::v5::internal::named_arg<char[5],char>,fmt::v5::internal::named_arg<char[4],char>,fmt::v5::internal::named_arg<int,char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&udl_a_w,
             (v5 *)"{first}{second}{first}{third}",(char (*) [30])&local_c0,
             (named_arg<char[5],_char> *)&local_f8,(named_arg<char[4],_char> *)&local_68,in_R9);
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)&gtest_ar,
             "format(\"{first}{second}{first}{third}\", fmt::arg(\"first\", \"abra\"), fmt::arg(\"second\", \"cad\"), fmt::arg(\"third\", 99))"
             ,"udl_a",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&udl_a_w,
             &udl_a);
  std::__cxx11::string::~string((string *)&udl_a_w);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_c0);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x767,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_f8,(Message *)&local_c0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_f8);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_c0);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  local_c0.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1f4a0c;
  local_b8 = 5;
  local_90 = L"abra";
  local_f8.super_named_arg_base<char>.name.data_ = "second";
  local_f8.super_named_arg_base<char>.name.size_ = 6;
  local_f8.value = (char (*) [5])0x1f4a24;
  gtest_ar.success_ = true;
  gtest_ar._1_3_ = 0;
  local_68.super_named_arg_base<char>.name.data_ = "third";
  local_68.super_named_arg_base<char>.name.size_ = 5;
  local_68.value = (char (*) [4])&gtest_ar.success_;
  fmt::v5::
  format<wchar_t[30],fmt::v5::internal::named_arg<wchar_t_const(&)[5],wchar_t>,fmt::v5::internal::named_arg<wchar_t_const(&)[4],wchar_t>,fmt::v5::internal::named_arg<int,wchar_t>>
            (&udl_a_w,(v5 *)L"{first}{second}{first}{third}",(wchar_t (*) [30])&local_c0,
             (named_arg<const_wchar_t_(&)[5],_wchar_t> *)&local_f8,
             (named_arg<const_wchar_t_(&)[4],_wchar_t> *)&local_68,(named_arg<int,_wchar_t> *)in_R9)
  ;
  local_c0.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1f4a0c;
  local_b8 = 5;
  local_90 = L"abra";
  local_f8.super_named_arg_base<char>.name.data_ = "second";
  local_f8.super_named_arg_base<char>.name.size_ = 6;
  local_f8.value = (char (*) [5])0x1f4a24;
  local_68.value = &local_fc;
  local_fc[0] = 'c';
  local_fc[1] = '\0';
  local_fc[2] = '\0';
  local_fc[3] = '\0';
  local_68.super_named_arg_base<char>.name.data_ = "third";
  local_68.super_named_arg_base<char>.name.size_ = 5;
  fmt::v5::
  format<wchar_t[30],fmt::v5::internal::named_arg<wchar_t[5],wchar_t>,fmt::v5::internal::named_arg<wchar_t[4],wchar_t>,fmt::v5::internal::named_arg<int,wchar_t>>
            ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)&gtest_ar
             ,(v5 *)L"{first}{second}{first}{third}",(wchar_t (*) [30])&local_c0,
             (named_arg<wchar_t[5],_wchar_t> *)&local_f8,(named_arg<wchar_t[4],_wchar_t> *)&local_68
             ,(named_arg<int,_wchar_t> *)in_R9);
  testing::internal::CmpHelperEQ<std::__cxx11::wstring,std::__cxx11::wstring>
            ((internal *)&gtest_ar_1,
             "format(L\"{first}{second}{first}{third}\", fmt::arg(L\"first\", L\"abra\"), fmt::arg(L\"second\", L\"cad\"), fmt::arg(L\"third\", 99))"
             ,"udl_a_w",
             (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)&gtest_ar
             ,&udl_a_w);
  std::__cxx11::wstring::~wstring((wstring *)&gtest_ar);
  if (gtest_ar_1.success_ == false) {
    testing::Message::Message((Message *)&local_c0);
    if (gtest_ar_1.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar_1.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x76d,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_f8,(Message *)&local_c0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_f8);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_c0);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_1.message_);
  std::__cxx11::wstring::~wstring((wstring *)&udl_a_w);
  std::__cxx11::string::~string((string *)&udl_a);
  return;
}

Assistant:

TEST(BoolTest, FormatBool) {
  EXPECT_EQ("true", format("{}", true));
  EXPECT_EQ("false", format("{}", false));
  EXPECT_EQ("1", format("{:d}", true));
  EXPECT_EQ("true ", format("{:5}", true));
  EXPECT_EQ(L"true", format(L"{}", true));
}